

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

ssize_t populate_binsettings(uint8_t *binsettings,Curl_easy *data)

{
  ssize_t sVar1;
  nghttp2_settings_entry iv [3];
  nghttp2_settings_entry local_38;
  undefined8 local_30;
  undefined4 local_28;
  uint local_24;
  
  local_38.settings_id = 3;
  local_38.value = Curl_multi_max_concurrent_streams(data->multi);
  local_30 = 0xa0000000000004;
  local_28 = 2;
  local_24 = (uint)(data->multi->push_cb != (curl_push_callback)0x0);
  sVar1 = nghttp2_pack_settings_payload(binsettings,0x50,&local_38,3);
  return sVar1;
}

Assistant:

static ssize_t populate_binsettings(uint8_t *binsettings,
                                    struct Curl_easy *data)
{
  nghttp2_settings_entry iv[H2_SETTINGS_IV_LEN];
  int ivlen;

  ivlen = populate_settings(iv, data);
  /* this returns number of bytes it wrote or a negative number on error. */
  return nghttp2_pack_settings_payload(binsettings, H2_BINSETTINGS_LEN,
                                       iv, ivlen);
}